

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O1

ALfloat alGetFloat(ALenum param)

{
  ALfloat x;
  
  APILOCK();
  IO_ENTRYINFO(ALEE_alGetFloat);
  writele32(param);
  x = (*REAL_alGetFloat)(param);
  writele32((uint32)x);
  check_al_error_events();
  check_al_async_states();
  APIUNLOCK();
  return x;
}

Assistant:

ALfloat alGetFloat(ALenum param)
{
    ALfloat retval;
    IO_START(alGetFloat);
    IO_ENUM(param);
    retval = REAL_alGetFloat(param);
    IO_FLOAT(retval);
    IO_END();
    return retval;
}